

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

SigHashType __thiscall cfd::core::Psbt::GetTxInSighashType(Psbt *this,uint32_t index)

{
  undefined8 uVar1;
  uint in_EDX;
  undefined4 extraout_EDX;
  undefined4 in_register_00000034;
  CfdException *this_00;
  SigHashType SVar2;
  Psbt *pPVar3;
  CfdError error_code;
  allocator local_61;
  string local_60 [32];
  CfdSourceLocation local_40;
  long local_28;
  wally_psbt *psbt_pointer;
  CfdException *pCStack_18;
  uint32_t index_local;
  Psbt *this_local;
  SigHashType *sighash_type;
  
  this_00 = (CfdException *)CONCAT44(in_register_00000034,index);
  pPVar3 = this;
  psbt_pointer._4_4_ = in_EDX;
  pCStack_18 = this_00;
  this_local = this;
  (**(code **)(*(long *)this_00 + 0x10))(this_00,in_EDX,0xacb,"GetTxInSighashType");
  local_28 = *(long *)&this_00->error_code_;
  if (*(int *)(*(long *)(local_28 + 0x10) + (ulong)psbt_pointer._4_4_ * 0x110 + 0x90) != 0) {
    SigHashType::SigHashType((SigHashType *)this);
    SigHashType::SetFromSigHashFlag
              ((SigHashType *)this,
               (uint8_t)*(undefined4 *)
                         (*(long *)(local_28 + 0x10) + (ulong)psbt_pointer._4_4_ * 0x110 + 0x90));
    SVar2.is_anyone_can_pay_ = (bool)(char)extraout_EDX;
    SVar2.is_fork_id_ = (bool)(char)((uint)extraout_EDX >> 8);
    SVar2._10_2_ = (short)((uint)extraout_EDX >> 0x10);
    SVar2._0_8_ = pPVar3;
    return SVar2;
  }
  local_40.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
               ,0x2f);
  error_code = (CfdError)((ulong)pPVar3 >> 0x20);
  local_40.filename = local_40.filename + 1;
  local_40.line = 0xad5;
  local_40.funcname = "GetTxInSighashType";
  logger::warn<>(&local_40,"sighash not found.");
  uVar1 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_60,"psbt sighash not found error.",&local_61);
  CfdException::CfdException(this_00,error_code,(string *)this);
  __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SigHashType Psbt::GetTxInSighashType(uint32_t index) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  if (psbt_pointer->inputs[index].sighash != 0) {
    SigHashType sighash_type;
    sighash_type.SetFromSigHashFlag(
        static_cast<uint8_t>(psbt_pointer->inputs[index].sighash));
    return sighash_type;
  } else {
    warn(CFD_LOG_SOURCE, "sighash not found.");
    throw CfdException(kCfdIllegalStateError, "psbt sighash not found error.");
  }
}